

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

bool Assimp::IFC::IntersectingLineSegments
               (IfcVector2 *n0,IfcVector2 *n1,IfcVector2 *m0,IfcVector2 *m1,IfcVector2 *out0,
               IfcVector2 *out1)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  aiVector2t<double> aVar6;
  aiVector2t<double> local_100;
  double local_f0;
  double local_e8;
  aiVector2t<double> local_e0;
  aiVector2t<double> local_d0;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  IfcFloat s1;
  IfcFloat s0;
  IfcFloat smalle;
  IfcFloat e;
  IfcVector2 n0_to_m1;
  IfcVector2 n1_to_m1;
  IfcVector2 n0_to_m0;
  IfcVector2 n0_to_n1;
  IfcVector2 *out1_local;
  IfcVector2 *out0_local;
  IfcVector2 *m1_local;
  IfcVector2 *m0_local;
  IfcVector2 *n1_local;
  IfcVector2 *n0_local;
  
  join_0x00001240_0x00001200_ = ::operator-(n1,n0);
  join_0x00001240_0x00001200_ = ::operator-(m0,n0);
  join_0x00001240_0x00001200_ = ::operator-(m1,n1);
  _e = ::operator-(m1,n0);
  smalle = 9.999999747378752e-06;
  s0 = 9.999999717180685e-10;
  dVar3 = aiVector2t<double>::SquareLength((aiVector2t<double> *)&n1_to_m1.y);
  if (9.99999949475751e-11 <= dVar3) {
    dVar3 = ::operator*((aiVector2t<double> *)&n1_to_m1.y,(aiVector2t<double> *)&n0_to_m0.y);
    dVar4 = aiVector2t<double>::Length((aiVector2t<double> *)&n1_to_m1.y);
    dVar5 = aiVector2t<double>::Length((aiVector2t<double> *)&n0_to_m0.y);
    if (ABS(dVar3) / (dVar4 * dVar5) <= 0.99999) {
      return false;
    }
  }
  dVar3 = aiVector2t<double>::SquareLength((aiVector2t<double> *)&n0_to_m1.y);
  if (9.99999949475751e-11 <= dVar3) {
    dVar3 = ::operator*((aiVector2t<double> *)&n0_to_m1.y,(aiVector2t<double> *)&n0_to_m0.y);
    dVar4 = aiVector2t<double>::Length((aiVector2t<double> *)&n0_to_m1.y);
    dVar5 = aiVector2t<double>::Length((aiVector2t<double> *)&n0_to_m0.y);
    if (ABS(dVar3) / (dVar4 * dVar5) <= 0.99999) {
      return false;
    }
  }
  if (ABS(n0_to_m0.y) <= ABS(n0_to_n1.x)) {
    s1 = n0_to_m0.x / n0_to_n1.x;
    local_a0 = n0_to_m1.x / n0_to_n1.x;
    if (((ABS(s1) == INFINITY) && (!NAN(ABS(s1)))) && (ABS(n0_to_m0.x) < 9.999999717180685e-10)) {
      s1 = 0.0;
    }
    if (((ABS(local_a0) == INFINITY) && (!NAN(ABS(local_a0)))) &&
       (ABS(n0_to_m1.x) < 9.999999717180685e-10)) {
      local_a0 = 0.0;
    }
  }
  else {
    s1 = n1_to_m1.y / n0_to_m0.y;
    local_a0 = e / n0_to_m0.y;
    if (((ABS(s1) == INFINITY) && (!NAN(ABS(s1)))) && (ABS(n1_to_m1.y) < 9.999999717180685e-10)) {
      s1 = 0.0;
    }
    if (((ABS(local_a0) == INFINITY) && (!NAN(ABS(local_a0)))) && (ABS(e) < 9.999999717180685e-10))
    {
      local_a0 = 0.0;
    }
  }
  if (local_a0 < s1) {
    std::swap<double>(&local_a0,&s1);
  }
  local_a8 = 0.0;
  pdVar2 = std::max<double>(&local_a8,&s1);
  s1 = *pdVar2;
  local_b0 = 0.0;
  pdVar2 = std::max<double>(&local_b0,&local_a0);
  local_a0 = *pdVar2;
  local_b8 = 1.0;
  pdVar2 = std::min<double>(&local_b8,&s1);
  s1 = *pdVar2;
  local_c0 = 1.0;
  pdVar2 = std::min<double>(&local_c0,&local_a0);
  local_a0 = *pdVar2;
  bVar1 = 9.999999747378752e-06 <= ABS(local_a0 - s1);
  if (bVar1) {
    local_e0 = ::operator*(s1,(aiVector2t<double> *)&n0_to_m0.y);
    local_d0 = ::operator+(n0,&local_e0);
    out0->x = local_d0.x;
    out0->y = local_d0.y;
    local_100 = ::operator*(local_a0,(aiVector2t<double> *)&n0_to_m0.y);
    aVar6 = ::operator+(n0,&local_100);
    local_f0 = aVar6.x;
    out1->x = local_f0;
    local_e8 = aVar6.y;
    out1->y = local_e8;
  }
  return bVar1;
}

Assistant:

bool IntersectingLineSegments(const IfcVector2& n0, const IfcVector2& n1,
    const IfcVector2& m0, const IfcVector2& m1,
    IfcVector2& out0, IfcVector2& out1)
{
    const IfcVector2 n0_to_n1 = n1 - n0;

    const IfcVector2 n0_to_m0 = m0 - n0;
    const IfcVector2 n1_to_m1 = m1 - n1;

    const IfcVector2 n0_to_m1 = m1 - n0;

    const IfcFloat e = 1e-5f;
    const IfcFloat smalle = 1e-9f;

    static const IfcFloat inf = std::numeric_limits<IfcFloat>::infinity();

    if (!(n0_to_m0.SquareLength() < e*e || std::fabs(n0_to_m0 * n0_to_n1) / (n0_to_m0.Length() * n0_to_n1.Length()) > 1-1e-5 )) {
        return false;
    }

    if (!(n1_to_m1.SquareLength() < e*e || std::fabs(n1_to_m1 * n0_to_n1) / (n1_to_m1.Length() * n0_to_n1.Length()) > 1-1e-5 )) {
        return false;
    }

    IfcFloat s0;
    IfcFloat s1;

    // pick the axis with the higher absolute difference so the result
    // is more accurate. Since we cannot guarantee that the axis with
    // the higher absolute difference is big enough as to avoid
    // divisions by zero, the case 0/0 ~ infinity is detected and
    // handled separately.
    if(std::fabs(n0_to_n1.x) > std::fabs(n0_to_n1.y)) {
        s0 = n0_to_m0.x / n0_to_n1.x;
        s1 = n0_to_m1.x / n0_to_n1.x;

        if (std::fabs(s0) == inf && std::fabs(n0_to_m0.x) < smalle) {
            s0 = 0.;
        }
        if (std::fabs(s1) == inf && std::fabs(n0_to_m1.x) < smalle) {
            s1 = 0.;
        }
    }
    else {
        s0 = n0_to_m0.y / n0_to_n1.y;
        s1 = n0_to_m1.y / n0_to_n1.y;

        if (std::fabs(s0) == inf && std::fabs(n0_to_m0.y) < smalle) {
            s0 = 0.;
        }
        if (std::fabs(s1) == inf && std::fabs(n0_to_m1.y) < smalle) {
            s1 = 0.;
        }
    }

    if (s1 < s0) {
        std::swap(s1,s0);
    }

    s0 = std::max(0.0,s0);
    s1 = std::max(0.0,s1);

    s0 = std::min(1.0,s0);
    s1 = std::min(1.0,s1);

    if (std::fabs(s1-s0) < e) {
        return false;
    }

    out0 = n0 + s0 * n0_to_n1;
    out1 = n0 + s1 * n0_to_n1;

    return true;
}